

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void nni_http_server_fini(nni_http_server *s)

{
  int *piVar1;
  int iVar2;
  nni_mtx *mtx;
  
  mtx = &http_servers_lk;
  nni_mtx_lock(&http_servers_lk);
  piVar1 = &s->refcnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    nni_list_remove(&http_servers,s);
    nni_mtx_unlock(&http_servers_lk);
    mtx = &s->mtx;
    nni_mtx_lock(mtx);
    http_server_stop(s);
    s->fini = true;
    iVar2 = nni_list_empty(&s->conns);
    if (iVar2 != 0) {
      nni_reap(&http_server_reap_list,s);
    }
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

void
nni_http_server_fini(nni_http_server *s)
{
	nni_mtx_lock(&http_servers_lk);
	s->refcnt--;
	if (s->refcnt != 0) {
		nni_mtx_unlock(&http_servers_lk);
		return;
	}
	nni_list_remove(&http_servers, s);
	nni_mtx_unlock(&http_servers_lk);

	nni_mtx_lock(&s->mtx);
	http_server_stop(s);
	s->fini = true;
	if (nni_list_empty(&s->conns)) {
		nni_reap(&http_server_reap_list, s);
	}
	nni_mtx_unlock(&s->mtx);
}